

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

char * __thiscall tetgenio::readline(tetgenio *this,char *string,FILE *infile,int *linenumber)

{
  bool bVar1;
  char *local_38;
  char *result;
  int *linenumber_local;
  FILE *infile_local;
  char *string_local;
  tetgenio *this_local;
  
  do {
    local_38 = fgets(string,0x7ff,(FILE *)infile);
    if (linenumber != (int *)0x0) {
      *linenumber = *linenumber + 1;
    }
    if (local_38 == (char *)0x0) {
      return (char *)0x0;
    }
    while( true ) {
      bVar1 = true;
      if (*local_38 != ' ') {
        bVar1 = *local_38 == '\t';
      }
      if (!bVar1) break;
      local_38 = local_38 + 1;
    }
    bVar1 = true;
    if ((*local_38 != '\0') && (bVar1 = true, *local_38 != '\r')) {
      bVar1 = *local_38 == '\n';
    }
  } while (bVar1);
  return local_38;
}

Assistant:

char* tetgenio::readline(char *string, FILE *infile, int *linenumber)
{
  char *result;

  // Search for a non-empty line.
  do {
    result = fgets(string, INPUTLINESIZE - 1, infile);
    if (linenumber) (*linenumber)++;
    if (result == (char *) NULL) {
      return (char *) NULL;
    }
    // Skip white spaces.
    while ((*result == ' ') || (*result == '\t')) result++;
    // If it's end of line, read another line and try again.
  } while ((*result == '\0') || (*result == '\r') || (*result == '\n'));
  return result;
}